

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<int,_true,_std::allocator<unsigned_long>_>::squeeze
          (View<int,_true,_std::allocator<unsigned_long>_> *this)

{
  geometry_type *this_00;
  size_t sVar1;
  unsigned_long *begin;
  size_t sVar2;
  size_t sVar3;
  size_t *psVar4;
  size_t j_1;
  size_t k;
  size_t j;
  ulong uVar5;
  
  testInvariant(this);
  sVar2 = dimension(this);
  if (sVar2 != 0) {
    sVar2 = dimension(this);
    uVar5 = 0;
    while( true ) {
      sVar3 = dimension(this);
      if (sVar3 <= uVar5) break;
      sVar3 = shape(this,uVar5);
      sVar2 = sVar2 - (sVar3 == 1);
      uVar5 = uVar5 + 1;
    }
    sVar3 = dimension(this);
    if (sVar2 != sVar3) {
      this_00 = &this->geometry_;
      if (sVar2 == 0) {
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(this_00,0);
        (this->geometry_).size_ = 1;
      }
      else {
        sVar3 = 0;
        for (uVar5 = 0; uVar5 < (this->geometry_).dimension_; uVar5 = uVar5 + 1) {
          psVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,uVar5);
          if (*psVar4 != 1) {
            psVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,uVar5);
            sVar1 = *psVar4;
            psVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shape(this_00,sVar3);
            *psVar4 = sVar1;
            psVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,uVar5)
            ;
            sVar1 = *psVar4;
            psVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(this_00,sVar3)
            ;
            *psVar4 = sVar1;
            sVar3 = sVar3 + 1;
          }
        }
        marray_detail::Geometry<std::allocator<unsigned_long>_>::resize(this_00,sVar2);
        begin = (this->geometry_).shape_;
        marray_detail::stridesFromShape<unsigned_long*,unsigned_long*>
                  (begin,begin + (this->geometry_).dimension_,(this->geometry_).shapeStrides_,
                   &(this->geometry_).coordinateOrder_);
        marray_detail::Geometry<std::allocator<unsigned_long>_>::updateSimplicity(this_00);
      }
    }
  }
  testInvariant(this);
  return;
}

Assistant:

void
View<T, isConst, A>::squeeze()
{
    testInvariant();
    if(dimension() != 0) {
        std::size_t newDimension = dimension();
        for(std::size_t j=0; j<dimension(); ++j) {
            if(shape(j) == 1) {
                --newDimension;
            }
        }
        if(newDimension != dimension()) {
            if(newDimension == 0) {
                geometry_.resize(0);
                geometry_.size() = 1;
            }
            else {
                for(std::size_t j=0, k=0; j<geometry_.dimension(); ++j) {
                    if(geometry_.shape(j) != 1) {
                        geometry_.shape(k) = geometry_.shape(j);
                        geometry_.strides(k) = geometry_.strides(j);
                        ++k;
                    }
                }
                geometry_.resize(newDimension);
                marray_detail::stridesFromShape(geometry_.shapeBegin(), geometry_.shapeEnd(), 
                    geometry_.shapeStridesBegin(), geometry_.coordinateOrder());
                updateSimplicity();
            }
        }
    }
    testInvariant();
}